

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-socket.c
# Opt level: O0

CURLcode cf_udp_connect(Curl_cfilter *cf,Curl_easy *data,_Bool blocking,_Bool *done)

{
  int *piVar1;
  CURLcode CVar2;
  CURLcode local_3c;
  CURLcode result;
  cf_socket_ctx *ctx;
  _Bool *done_local;
  _Bool blocking_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  piVar1 = (int *)cf->ctx;
  local_3c = CURLE_COULDNT_CONNECT;
  if ((cf->field_0x24 & 1) != 0) {
    *done = true;
    return CURLE_OK;
  }
  *done = false;
  if (piVar1[0x26] == -1) {
    local_3c = cf_socket_open(cf,data);
    if (local_3c == CURLE_OK) {
      if (*piVar1 == 5) {
        CVar2 = cf_udp_setup_quic(cf,data);
        if (CVar2 != CURLE_OK) {
          return CVar2;
        }
        local_3c = CURLE_OK;
        if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0))
           && ((cf != (Curl_cfilter *)0x0 && (0 < cf->cft->log_level)))) {
          Curl_trc_cf_infof(data,cf,"cf_udp_connect(), opened socket=%d (%s:%d)",
                            (ulong)(uint)piVar1[0x26],piVar1 + 0x45,(ulong)(uint)piVar1[0x51]);
        }
      }
      else if ((((data != (Curl_easy *)0x0) &&
                ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0)) &&
               (cf != (Curl_cfilter *)0x0)) && (0 < cf->cft->log_level)) {
        Curl_trc_cf_infof(data,cf,"cf_udp_connect(), opened socket=%d (unconnected)",
                          (ulong)(uint)piVar1[0x26]);
      }
      *done = true;
      cf->field_0x24 = cf->field_0x24 & 0xfe | 1;
    }
    else if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0))
            && ((cf != (Curl_cfilter *)0x0 && (0 < cf->cft->log_level)))) {
      Curl_trc_cf_infof(data,cf,"cf_udp_connect(), open failed -> %d",(ulong)local_3c);
    }
  }
  return local_3c;
}

Assistant:

static CURLcode cf_udp_connect(struct Curl_cfilter *cf,
                               struct Curl_easy *data,
                               bool blocking, bool *done)
{
  struct cf_socket_ctx *ctx = cf->ctx;
  CURLcode result = CURLE_COULDNT_CONNECT;

  (void)blocking;
  if(cf->connected) {
    *done = TRUE;
    return CURLE_OK;
  }
  *done = FALSE;
  if(ctx->sock == CURL_SOCKET_BAD) {
    result = cf_socket_open(cf, data);
    if(result) {
      CURL_TRC_CF(data, cf, "cf_udp_connect(), open failed -> %d", result);
      goto out;
    }

    if(ctx->transport == TRNSPRT_QUIC) {
      result = cf_udp_setup_quic(cf, data);
      if(result)
        goto out;
      CURL_TRC_CF(data, cf, "cf_udp_connect(), opened socket=%"
                  CURL_FORMAT_SOCKET_T " (%s:%d)",
                  ctx->sock, ctx->l_ip, ctx->l_port);
    }
    else {
      CURL_TRC_CF(data, cf, "cf_udp_connect(), opened socket=%"
                  CURL_FORMAT_SOCKET_T " (unconnected)", ctx->sock);
    }
    *done = TRUE;
    cf->connected = TRUE;
  }
out:
  return result;
}